

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_arith_encode_log2(stb_arith *a,uint totalfreq2,uint freq,uint cumfreq)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = a->range_low;
  uVar4 = a->range_high - uVar1 >> ((byte)totalfreq2 & 0x1f);
  uVar2 = cumfreq * uVar4;
  uVar3 = uVar2 + uVar1;
  a->range_low = uVar3;
  a->range_high = uVar3 + uVar4 * freq;
  if (CARRY4(uVar2,uVar1)) {
    stb__arith_carry(a);
  }
  while (a->range_high - a->range_low < 0x1000000) {
    stb__renorm_encoder(a);
  }
  return;
}

Assistant:

void stb_arith_encode_log2(stb_arith *a, unsigned int totalfreq2, unsigned int freq, unsigned int cumfreq)
{
   unsigned int range = a->range_high - a->range_low;
   unsigned int old = a->range_low;
   range >>= totalfreq2;
   a->range_low += range * cumfreq;
   a->range_high = a->range_low + range*freq;
   if (a->range_low < old)
      stb__arith_carry(a);
   while (a->range_high - a->range_low < 0x1000000)
      stb__renorm_encoder(a);
}